

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.hpp
# Opt level: O1

void __thiscall
helics::InputInfo::sourceInformation::sourceInformation
          (sourceInformation *this,string_view key_,string_view type_,string_view units_)

{
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this,key_._M_str,key_._M_str + key_._M_len);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->type,type_._M_str,type_._M_str + type_._M_len);
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->units,units_._M_str,units_._M_str + units_._M_len);
  return;
}

Assistant:

sourceInformation(std::string_view key_, std::string_view type_, std::string_view units_):
            key(key_), type(type_), units(units_)
        {
        }